

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_solid.cc
# Opt level: O2

vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_> *
__thiscall
hwtest::pgraph::Line::mthds
          (vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
           *__return_storage_ptr__,Line *this)

{
  mt19937 *this_00;
  TestOptions *opt;
  uint32_t uVar1;
  const_iterator cVar2;
  MthdNop *pMVar3;
  vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
  *pvVar4;
  MthdVtxY32 *pMVar5;
  MthdVtxX32 *pMVar6;
  MthdSolidFormat *pMVar7;
  MthdOperation *pMVar8;
  MthdMissing *pMVar9;
  MthdCtxBeta *pMVar10;
  MthdCtxRop *pMVar11;
  MthdCtxPattern *pMVar12;
  MthdCtxClip *pMVar13;
  MthdDmaNotify *pMVar14;
  MthdPmTrigger *pMVar15;
  MthdPatch *pMVar16;
  result_type rVar17;
  MthdSolidColor *pMVar18;
  MthdVtxXy *pMVar19;
  MthdCtxSurf *this_01;
  MthdCtxSurf2D *this_02;
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l;
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l_00;
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l_01;
  allocator_type local_4c1;
  allocator local_4c0;
  allocator local_4bf;
  allocator local_4be;
  allocator local_4bd;
  allocator local_4bc;
  allocator local_4bb;
  allocator local_4ba;
  allocator local_4b9;
  allocator local_4b8;
  allocator local_4b7;
  allocator local_4b6;
  allocator local_4b5;
  allocator local_4b4;
  allocator local_4b3;
  allocator local_4b2;
  allocator local_4b1;
  allocator local_4b0;
  allocator local_4af;
  allocator local_4ae;
  allocator local_4ad;
  allocator local_4ac;
  allocator local_4ab;
  allocator local_4aa;
  allocator local_4a9;
  MthdNop *local_4a8;
  vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
  *local_4a0;
  const_iterator local_498;
  MthdVtxY32 *local_490;
  MthdVtxX32 *local_488;
  MthdVtxXy *local_480;
  MthdVtxY32 *local_478;
  MthdVtxX32 *local_470;
  MthdVtxY32 *local_468;
  MthdVtxX32 *local_460;
  MthdVtxXy *local_458;
  MthdVtxXy *local_450;
  MthdSolidColor *local_448;
  MthdSolidFormat *local_440;
  MthdOperation *local_438;
  MthdMissing *local_430;
  MthdCtxBeta *local_428;
  MthdCtxRop *local_420;
  MthdCtxPattern *local_418;
  MthdCtxClip *local_410;
  MthdDmaNotify *local_408;
  MthdPmTrigger *local_400;
  MthdPatch *local_3f8;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  MthdDmaNotify *local_390;
  MthdCtxClip *local_388;
  MthdCtxPattern *local_380;
  MthdCtxRop *local_378;
  MthdCtxBeta *local_370;
  MthdMissing *local_368;
  MthdOperation *local_360;
  MthdSolidFormat *local_358;
  MthdSolidColor *local_350;
  MthdVtxXy *local_348;
  MthdVtxXy *local_340;
  MthdVtxX32 *local_338;
  MthdVtxY32 *local_330;
  MthdVtxX32 *local_328;
  MthdVtxY32 *local_320;
  MthdVtxXy *local_318;
  MthdVtxX32 *local_310;
  MthdVtxY32 *local_308;
  MthdSolidColor *local_300;
  MthdVtxXy *local_2f8;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_4a0 = __return_storage_ptr__;
  local_4a8 = (MthdNop *)operator_new(0x25950);
  this_00 = &(this->super_Class).rnd;
  rVar17 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_3f0,"nop",&local_4a9);
  pMVar3 = local_4a8;
  opt = &(this->super_Class).opt;
  MthdNop::SingleMthdTest
            (local_4a8,opt,(uint32_t)rVar17,&local_3f0,-1,(this->super_Class).cls,0x100,1,4);
  local_3b0._M_dataplus._M_p = (pointer)pMVar3;
  local_498._M_current = (SingleMthdTest **)operator_new(0x25950);
  rVar17 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_3d0,"notify",&local_4aa);
  cVar2._M_current = local_498._M_current;
  MthdNotify::SingleMthdTest
            ((MthdNotify *)local_498._M_current,opt,(uint32_t)rVar17,&local_3d0,0,
             (this->super_Class).cls,0x104,1,4);
  local_3b0._M_string_length = (size_type)cVar2._M_current;
  local_3f8 = (MthdPatch *)operator_new(0x25950);
  rVar17 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_2d0,"patch",&local_4ab);
  pMVar16 = local_3f8;
  MthdPatch::SingleMthdTest
            (local_3f8,opt,(uint32_t)rVar17,&local_2d0,-1,(this->super_Class).cls,0x10c,1,4);
  local_3b0.field_2._M_allocated_capacity = (size_type)pMVar16;
  local_400 = (MthdPmTrigger *)operator_new(0x25950);
  rVar17 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_2f0,"pm_trigger",&local_4ac);
  pMVar15 = local_400;
  MthdPmTrigger::SingleMthdTest
            (local_400,opt,(uint32_t)rVar17,&local_2f0,-1,(this->super_Class).cls,0x140,1,4);
  local_3b0.field_2._8_8_ = pMVar15;
  local_408 = (MthdDmaNotify *)operator_new(0x25950);
  rVar17 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_50,"dma_notify",&local_4ad);
  pMVar14 = local_408;
  MthdDmaNotify::SingleMthdTest
            (local_408,opt,(uint32_t)rVar17,&local_50,1,(this->super_Class).cls,0x180,1,4);
  local_390 = pMVar14;
  local_410 = (MthdCtxClip *)operator_new(0x25950);
  rVar17 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_70,"ctx_clip",&local_4ae);
  pMVar13 = local_410;
  MthdCtxClip::SingleMthdTest
            (local_410,opt,(uint32_t)rVar17,&local_70,2,(this->super_Class).cls,0x184,1,4);
  local_388 = pMVar13;
  local_418 = (MthdCtxPattern *)operator_new(0x25958);
  rVar17 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_90,"ctx_pattern",&local_4af);
  pMVar12 = local_418;
  uVar1 = (this->super_Class).cls;
  MthdCtxPattern::MthdCtxPattern
            (local_418,opt,(uint32_t)rVar17,&local_90,3,uVar1,0x188,uVar1 != 0x1c);
  local_380 = pMVar12;
  local_420 = (MthdCtxRop *)operator_new(0x25950);
  rVar17 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_b0,"ctx_rop",&local_4b0);
  pMVar11 = local_420;
  MthdCtxRop::SingleMthdTest
            (local_420,opt,(uint32_t)rVar17,&local_b0,4,(this->super_Class).cls,0x18c,1,4);
  local_378 = pMVar11;
  local_428 = (MthdCtxBeta *)operator_new(0x25950);
  rVar17 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_d0,"ctx_beta",&local_4b1);
  pMVar10 = local_428;
  MthdCtxBeta::SingleMthdTest
            (local_428,opt,(uint32_t)rVar17,&local_d0,5,(this->super_Class).cls,400,1,4);
  local_370 = pMVar10;
  local_430 = (MthdMissing *)operator_new(0x25950);
  rVar17 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_f0,"missing",&local_4b2);
  pMVar9 = local_430;
  MthdMissing::SingleMthdTest
            (local_430,opt,(uint32_t)rVar17,&local_f0,-1,(this->super_Class).cls,0x200,1,4);
  local_368 = pMVar9;
  local_438 = (MthdOperation *)operator_new(0x25958);
  rVar17 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_110,"operation",&local_4b3);
  pMVar8 = local_438;
  uVar1 = (this->super_Class).cls;
  MthdOperation::MthdOperation
            (local_438,opt,(uint32_t)rVar17,&local_110,8,uVar1,0x2fc,uVar1 != 0x1c);
  local_360 = pMVar8;
  local_440 = (MthdSolidFormat *)operator_new(0x25958);
  rVar17 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_130,"format",&local_4b4);
  pMVar7 = local_440;
  uVar1 = (this->super_Class).cls;
  MthdSolidFormat::MthdSolidFormat
            (local_440,opt,(uint32_t)rVar17,&local_130,9,uVar1,0x300,uVar1 != 0x1c);
  local_358 = pMVar7;
  local_448 = (MthdSolidColor *)operator_new(0x25950);
  rVar17 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_150,"color",&local_4b5);
  pMVar18 = local_448;
  MthdSolidColor::SingleMthdTest
            (local_448,opt,(uint32_t)rVar17,&local_150,10,(this->super_Class).cls,0x304,1,4);
  local_350 = pMVar18;
  local_450 = (MthdVtxXy *)operator_new(0x25958);
  rVar17 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_170,"line.0.xy",&local_4b6);
  pMVar19 = local_450;
  MthdVtxXy::MthdVtxXy
            (local_450,opt,(uint32_t)rVar17,&local_170,0xb,(this->super_Class).cls,0x400,0x10,8,1);
  local_348 = pMVar19;
  local_458 = (MthdVtxXy *)operator_new(0x25958);
  rVar17 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_190,"line.1.xy",&local_4b7);
  pMVar19 = local_458;
  MthdVtxXy::MthdVtxXy
            (local_458,opt,(uint32_t)rVar17,&local_190,0xc,(this->super_Class).cls,0x404,0x10,8,4);
  local_340 = pMVar19;
  local_460 = (MthdVtxX32 *)operator_new(0x25958);
  rVar17 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_1b0,"line32.0.x",&local_4b8);
  pMVar6 = local_460;
  MthdVtxX32::MthdVtxX32
            (local_460,opt,(uint32_t)rVar17,&local_1b0,0xd,(this->super_Class).cls,0x480,8,0x10,1);
  local_338 = pMVar6;
  local_468 = (MthdVtxY32 *)operator_new(0x25958);
  rVar17 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_1d0,"line32.0.y",&local_4b9);
  pMVar5 = local_468;
  MthdVtxY32::MthdVtxY32
            (local_468,opt,(uint32_t)rVar17,&local_1d0,0xe,(this->super_Class).cls,0x484,8,0x10,1);
  local_330 = pMVar5;
  local_470 = (MthdVtxX32 *)operator_new(0x25958);
  rVar17 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_1f0,"line32.1.x",&local_4ba);
  pMVar6 = local_470;
  MthdVtxX32::MthdVtxX32
            (local_470,opt,(uint32_t)rVar17,&local_1f0,0xf,(this->super_Class).cls,0x488,8,0x10,4);
  local_328 = pMVar6;
  local_478 = (MthdVtxY32 *)operator_new(0x25958);
  rVar17 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_210,"line32.1.y",&local_4bb);
  pMVar5 = local_478;
  MthdVtxY32::MthdVtxY32
            (local_478,opt,(uint32_t)rVar17,&local_210,0x10,(this->super_Class).cls,0x48c,8,0x10,4);
  local_320 = pMVar5;
  local_480 = (MthdVtxXy *)operator_new(0x25958);
  rVar17 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_230,"polyline.xy",&local_4bc);
  pMVar19 = local_480;
  MthdVtxXy::MthdVtxXy
            (local_480,opt,(uint32_t)rVar17,&local_230,0x11,(this->super_Class).cls,0x500,0x20,4,6);
  local_318 = pMVar19;
  local_488 = (MthdVtxX32 *)operator_new(0x25958);
  rVar17 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_250,"polyline32.x",&local_4bd);
  pMVar6 = local_488;
  MthdVtxX32::MthdVtxX32
            (local_488,opt,(uint32_t)rVar17,&local_250,0x12,(this->super_Class).cls,0x580,0x10,8,6);
  local_310 = pMVar6;
  local_490 = (MthdVtxY32 *)operator_new(0x25958);
  rVar17 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_270,"polyline32.y",&local_4be);
  pMVar5 = local_490;
  MthdVtxY32::MthdVtxY32
            (local_490,opt,(uint32_t)rVar17,&local_270,0x13,(this->super_Class).cls,0x584,0x10,8,6);
  local_308 = pMVar5;
  pMVar18 = (MthdSolidColor *)operator_new(0x25950);
  rVar17 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_290,"cpolyline.color",&local_4bf);
  MthdSolidColor::SingleMthdTest
            (pMVar18,opt,(uint32_t)rVar17,&local_290,0x14,(this->super_Class).cls,0x600,0x10,8);
  local_300 = pMVar18;
  pMVar19 = (MthdVtxXy *)operator_new(0x25958);
  rVar17 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_2b0,"cpolyline.xy",&local_4c0);
  MthdVtxXy::MthdVtxXy
            (pMVar19,opt,(uint32_t)rVar17,&local_2b0,0x15,(this->super_Class).cls,0x604,0x10,8,6);
  pvVar4 = local_4a0;
  __l._M_len = 0x18;
  __l._M_array = (iterator)&local_3b0;
  local_2f8 = pMVar19;
  std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>::
  vector(local_4a0,__l,&local_4c1);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_3f0);
  cVar2._M_current =
       (pvVar4->
       super__Vector_base<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  if ((this->super_Class).cls == 0x1c) {
    this_01 = (MthdCtxSurf *)operator_new(0x25958);
    rVar17 = std::
             mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
             ::operator()(this_00);
    std::__cxx11::string::string((string *)&local_3b0,"ctx_dst",(allocator *)&local_3d0);
    MthdCtxSurf::MthdCtxSurf
              (this_01,opt,(uint32_t)rVar17,&local_3b0,7,(this->super_Class).cls,0x194,0);
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)&local_3f0;
    local_3f0._M_dataplus._M_p = (pointer)this_01;
    std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
    ::insert(local_4a0,cVar2,__l_00);
  }
  else {
    local_4a8 = (MthdNop *)operator_new(0x25950);
    rVar17 = std::
             mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
             ::operator()(this_00);
    local_498._M_current = cVar2._M_current;
    std::__cxx11::string::string((string *)&local_3b0,"ctx_beta4",(allocator *)&local_2d0);
    pMVar3 = local_4a8;
    MthdCtxBeta4::SingleMthdTest
              ((MthdCtxBeta4 *)local_4a8,opt,(uint32_t)rVar17,&local_3b0,6,(this->super_Class).cls,
               0x194,1,4);
    local_3d0._M_dataplus._M_p = (pointer)pMVar3;
    this_02 = (MthdCtxSurf2D *)operator_new(0x25958);
    rVar17 = std::
             mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
             ::operator()(this_00);
    std::__cxx11::string::string((string *)&local_3f0,"ctx_surf2d",(allocator *)&local_2f0);
    cVar2._M_current = local_498._M_current;
    MthdCtxSurf2D::MthdCtxSurf2D
              (this_02,opt,(uint32_t)rVar17,&local_3f0,7,(this->super_Class).cls,0x198,1);
    __l_01._M_len = 2;
    __l_01._M_array = (iterator)&local_3d0;
    local_3d0._M_string_length = (size_type)this_02;
    std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
    ::insert(local_4a0,cVar2,__l_01);
    std::__cxx11::string::~string((string *)&local_3f0);
  }
  std::__cxx11::string::~string((string *)&local_3b0);
  return local_4a0;
}

Assistant:

std::vector<SingleMthdTest *> Line::mthds() {
	std::vector<SingleMthdTest *> res = {
		new MthdNop(opt, rnd(), "nop", -1, cls, 0x100),
		new MthdNotify(opt, rnd(), "notify", 0, cls, 0x104),
		new MthdPatch(opt, rnd(), "patch", -1, cls, 0x10c),
		new MthdPmTrigger(opt, rnd(), "pm_trigger", -1, cls, 0x140),
		new MthdDmaNotify(opt, rnd(), "dma_notify", 1, cls, 0x180),
		new MthdCtxClip(opt, rnd(), "ctx_clip", 2, cls, 0x184),
		new MthdCtxPattern(opt, rnd(), "ctx_pattern", 3, cls, 0x188, cls != 0x1c),
		new MthdCtxRop(opt, rnd(), "ctx_rop", 4, cls, 0x18c),
		new MthdCtxBeta(opt, rnd(), "ctx_beta", 5, cls, 0x190),
		new MthdMissing(opt, rnd(), "missing", -1, cls, 0x200),
		new MthdOperation(opt, rnd(), "operation", 8, cls, 0x2fc, cls != 0x1c),
		new MthdSolidFormat(opt, rnd(), "format", 9, cls, 0x300, cls != 0x1c),
		new MthdSolidColor(opt, rnd(), "color", 10, cls, 0x304),
		new MthdVtxXy(opt, rnd(), "line.0.xy", 11, cls, 0x400, 0x10, 8, VTX_FIRST),
		new MthdVtxXy(opt, rnd(), "line.1.xy", 12, cls, 0x404, 0x10, 8, VTX_DRAW),
		new MthdVtxX32(opt, rnd(), "line32.0.x", 13, cls, 0x480, 8, 0x10, VTX_FIRST),
		new MthdVtxY32(opt, rnd(), "line32.0.y", 14, cls, 0x484, 8, 0x10, VTX_FIRST),
		new MthdVtxX32(opt, rnd(), "line32.1.x", 15, cls, 0x488, 8, 0x10, VTX_DRAW),
		new MthdVtxY32(opt, rnd(), "line32.1.y", 16, cls, 0x48c, 8, 0x10, VTX_DRAW),
		new MthdVtxXy(opt, rnd(), "polyline.xy", 17, cls, 0x500, 0x20, 4, VTX_POLY | VTX_DRAW),
		new MthdVtxX32(opt, rnd(), "polyline32.x", 18, cls, 0x580, 0x10, 8, VTX_POLY | VTX_DRAW),
		new MthdVtxY32(opt, rnd(), "polyline32.y", 19, cls, 0x584, 0x10, 8, VTX_POLY | VTX_DRAW),
		new MthdSolidColor(opt, rnd(), "cpolyline.color", 20, cls, 0x600, 0x10, 8),
		new MthdVtxXy(opt, rnd(), "cpolyline.xy", 21, cls, 0x604, 0x10, 8, VTX_POLY | VTX_DRAW),
	};
	if (cls == 0x1c) {
		res.insert(res.end(), {
			new MthdCtxSurf(opt, rnd(), "ctx_dst", 7, cls, 0x194, 0),
		});
	} else {
		res.insert(res.end(), {
			new MthdCtxBeta4(opt, rnd(), "ctx_beta4", 6, cls, 0x194),
			new MthdCtxSurf2D(opt, rnd(), "ctx_surf2d", 7, cls, 0x198, SURF2D_NV10),
		});
	}
	return res;
}